

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O3

void renderScene(void)

{
  int nextOffset;
  int local_c;
  
  local_c = 0;
  (*glad_glBindFramebuffer)(0x8d40,g_gl.framebuffers[1]);
  (*glad_glViewport)(0,0,g_framebuffer.w,g_framebuffer.h);
  (*glad_glEnable)(0xb71);
  (*glad_glDepthFunc)(0x201);
  (*glad_glPatchParameteri)(0x8e72,1);
  if (g_patch.flags.wire == true) {
    (*glad_glPolygonMode)(0x408,0x1b01);
  }
  (*glad_glClearColor)(0.5,0.5,0.5,1.0);
  (*glad_glClear)(0x4100);
  (*glad_glBindBuffer)(0x8f3f,g_gl.streams[1]->gl);
  loadSubdCounterBuffer(&local_c);
  loadTransformBuffer();
  (*glad_glUseProgram)(g_gl.programs[1]);
  (*glad_glBindVertexArray)(g_gl.vertexArrays[0]);
  if (g_patch.method == 1) {
    renderSceneGs(renderScene::offset);
  }
  else if (g_patch.method == 0) {
    renderSceneTs(renderScene::offset);
  }
  renderScene::offset = local_c;
  if (g_patch.flags.wire == true) {
    (*glad_glPolygonMode)(0x408,0x1b02);
  }
  if (g_patch.flags.net == true) {
    (*glad_glPointSize)(10.0);
    (*glad_glUseProgram)(g_gl.programs[2]);
    (*glad_glDrawArrays)(0,0,0x10);
  }
  (*glad_glDisable)(0xb71);
  return;
}

Assistant:

void renderScene()
{
    static int offset = 0;
    int nextOffset = 0;

    // configure GL state
    glBindFramebuffer(GL_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_SCENE]);
    glViewport(0, 0, g_framebuffer.w, g_framebuffer.h);
    glEnable(GL_DEPTH_TEST);
    glDepthFunc(GL_LESS);
    glPatchParameteri(GL_PATCH_VERTICES, 1);
    if (g_patch.flags.wire)
        glPolygonMode(GL_FRONT_AND_BACK, GL_LINE);

    // clear framebuffer
    glClearColor(0.5, 0.5, 0.5, 1.0);
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

    // bind buffers
    djgb_glbind(g_gl.streams[STREAM_SUBD_COUNTER], GL_DRAW_INDIRECT_BUFFER);
    loadSubdCounterBuffer(&nextOffset);
    loadTransformBuffer();
    glUseProgram(g_gl.programs[PROGRAM_CC]);
    glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_EMPTY]);

    // render terrain
    if (g_patch.method == METHOD_TS)
        renderSceneTs(offset);
    else if (g_patch.method == METHOD_GS)
        renderSceneGs(offset);

    offset = nextOffset;

    // reset GL state
    if (g_patch.flags.wire)
        glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);

    // render the CC net
    if (g_patch.flags.net) {
        glPointSize(10.f);
        glUseProgram(g_gl.programs[PROGRAM_CCNET]);
        glDrawArrays(GL_POINTS, 0, 16);
    }

    // reset GL state
    glDisable(GL_DEPTH_TEST);
}